

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getDigits(char *zDate,...)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  char *pcVar11;
  int *local_e0;
  int local_c8 [18];
  va_list ap;
  
  local_e0 = (int *)&stack0x00000008;
  uVar5 = 8;
  iVar3 = 0;
  while( true ) {
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      piVar4 = (int *)((long)local_c8 + uVar6);
    }
    else {
      piVar4 = local_e0;
      local_e0 = local_e0 + 2;
    }
    iVar1 = *piVar4;
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      piVar4 = (int *)((long)local_c8 + uVar6);
    }
    else {
      piVar4 = local_e0;
      local_e0 = local_e0 + 2;
    }
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      piVar8 = (int *)((long)local_c8 + uVar6);
    }
    else {
      piVar8 = local_e0;
      local_e0 = local_e0 + 2;
    }
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      piVar9 = (int *)((long)local_c8 + uVar6);
    }
    else {
      piVar9 = local_e0;
      local_e0 = local_e0 + 2;
    }
    iVar2 = *piVar9;
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      piVar9 = (int *)((long)local_c8 + uVar6);
    }
    else {
      piVar9 = local_e0;
      local_e0 = local_e0 + 2;
    }
    if (iVar1 == 0) {
      iVar10 = 0;
      pcVar11 = zDate;
    }
    else {
      pcVar11 = zDate + (ulong)(iVar1 - 1) + 1;
      lVar7 = 0;
      iVar10 = 0;
      do {
        if ((ulong)(byte)zDate[lVar7] - 0x3a < 0xfffffffffffffff6) {
          return iVar3;
        }
        iVar10 = (int)zDate[lVar7] + iVar10 * 10 + -0x30;
        lVar7 = lVar7 + 1;
      } while (iVar1 != (int)lVar7);
    }
    if (iVar10 < *piVar4) {
      return iVar3;
    }
    if (*piVar8 < iVar10) {
      return iVar3;
    }
    if ((iVar2 != 0) && (iVar2 != *pcVar11)) break;
    zDate = pcVar11 + 1;
    iVar3 = iVar3 + 1;
    **(int **)piVar9 = iVar10;
    if (iVar2 == 0) {
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int getDigits(const char *zDate, ...){
  va_list ap;
  int val;
  int N;
  int min;
  int max;
  int nextC;
  int *pVal;
  int cnt = 0;
  va_start(ap, zDate);
  do{
    N = va_arg(ap, int);
    min = va_arg(ap, int);
    max = va_arg(ap, int);
    nextC = va_arg(ap, int);
    pVal = va_arg(ap, int*);
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<min || val>max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *pVal = val;
    zDate++;
    cnt++;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}